

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.hpp
# Opt level: O3

string * __thiscall
toml::detail::
make_string<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
          (string *__return_storage_ptr__,detail *this,
          __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> first,
          __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> last)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (this == (detail *)first._M_current) {
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    std::__cxx11::string::
    _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
              ((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string make_string(Iterator first, Iterator last)
{
    if(first == last) {return "";}
    return std::string(first, last);
}